

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O1

value class_metadata(klass cls)

{
  char *__s;
  value v;
  value *ppvVar1;
  value pvVar2;
  value *ppvVar3;
  value pvVar4;
  size_t length;
  value pvVar5;
  size_t size;
  undefined8 *puVar6;
  size_t position;
  
  v = value_create_map((value *)0x0,6);
  if (v == (value)0x0) {
    return (value)0x0;
  }
  ppvVar1 = value_to_map(v);
  pvVar2 = value_create_array((value *)0x0,2);
  pvVar4 = (value)0x0;
  if (pvVar2 != (value)0x0) {
    ppvVar3 = value_to_array(pvVar2);
    pvVar4 = value_create_string("name",4);
    *ppvVar3 = pvVar4;
    if (pvVar4 != (value)0x0) {
      __s = cls->name;
      length = strlen(__s);
      pvVar5 = value_create_string(__s,length);
      ppvVar3[1] = pvVar5;
      pvVar4 = pvVar2;
      if (pvVar5 != (value)0x0) goto LAB_0011cc57;
    }
    value_type_destroy(pvVar2);
    pvVar4 = (value)0x0;
  }
LAB_0011cc57:
  *ppvVar1 = pvVar4;
  if (pvVar4 == (value)0x0) goto LAB_0011cd95;
  size = vector_size(cls->constructors);
  pvVar2 = value_create_array((value *)0x0,2);
  pvVar4 = (value)0x0;
  if (pvVar2 != (value)0x0) {
    ppvVar3 = value_to_array(pvVar2);
    pvVar4 = value_create_string("constructors",0xc);
    *ppvVar3 = pvVar4;
    if (pvVar4 != (value)0x0) {
      pvVar4 = value_create_array((value *)0x0,size);
      ppvVar3[1] = pvVar4;
      if (pvVar4 != (value)0x0) {
        ppvVar3 = value_to_array(pvVar4);
        pvVar4 = pvVar2;
        if (size != 0) {
          position = 0;
          do {
            puVar6 = (undefined8 *)vector_at(cls->constructors,position);
            pvVar2 = constructor_metadata((constructor)*puVar6);
            ppvVar3[position] = pvVar2;
            position = position + 1;
          } while (size != position);
        }
        goto LAB_0011cd0f;
      }
    }
    value_type_destroy(pvVar2);
    pvVar4 = (value)0x0;
  }
LAB_0011cd0f:
  ppvVar1[1] = pvVar4;
  if (pvVar4 != (value)0x0) {
    pvVar4 = class_metadata_methods_impl("methods",8,cls->methods);
    ppvVar1[2] = pvVar4;
    if (pvVar4 != (value)0x0) {
      pvVar4 = class_metadata_methods_impl("static_methods",0xf,cls->static_methods);
      ppvVar1[3] = pvVar4;
      if (pvVar4 != (value)0x0) {
        pvVar4 = class_metadata_attributes_impl("attributes",0xb,cls->attributes);
        ppvVar1[4] = pvVar4;
        if (pvVar4 != (value)0x0) {
          pvVar4 = class_metadata_attributes_impl("static_attributes",0x12,cls->static_attributes);
          ppvVar1[5] = pvVar4;
          if (pvVar4 != (value)0x0) {
            return v;
          }
        }
      }
    }
  }
LAB_0011cd95:
  value_type_destroy(v);
  return (value)0x0;
}

Assistant:

value class_metadata(klass cls)
{
	/* The structure of the metadata is:
	* {
	*	name: "ClassName",
	*	constructors: [{}],
	*	methods: [{}],
	*	static_methods: [{}],
	*	attributes: {
	*		"attr1": {}
	*	},
	*	static_attributes: {
	*		"static_attr1": {}
	*	}
	* }
	*/

	/* Create class map (name + constructors + methods + static_methods + attributes + static_attributes) */
	value *c_map, c = value_create_map(NULL, 6);

	if (c == NULL)
	{
		return NULL;
	}

	c_map = value_to_map(c);

	/* Create class name array */
	c_map[0] = class_metadata_name(cls);

	if (c_map[0] == NULL)
	{
		goto error_value;
	}

	/* Create constructors array */
	c_map[1] = class_metadata_constructors(cls);

	if (c_map[1] == NULL)
	{
		goto error_value;
	}

	/* Create class methods array */
	c_map[2] = class_metadata_methods(cls);

	if (c_map[2] == NULL)
	{
		goto error_value;
	}

	/* Create class static_methods array */
	c_map[3] = class_metadata_static_methods(cls);

	if (c_map[3] == NULL)
	{
		goto error_value;
	}

	/* Create class attributes array */
	c_map[4] = class_metadata_attributes(cls);

	if (c_map[4] == NULL)
	{
		goto error_value;
	}

	/* Create class static_attributes array */
	c_map[5] = class_metadata_static_attributes(cls);

	if (c_map[5] == NULL)
	{
		goto error_value;
	}

	return c;

error_value:
	value_type_destroy(c);
	return NULL;
}